

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall google::protobuf::compiler::Parser::Consume(Parser *this,char *text)

{
  char *pcVar1;
  bool bVar2;
  allocator local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  char *local_20;
  char *text_local;
  Parser *this_local;
  
  local_20 = text;
  text_local = (char *)this;
  bVar2 = TryConsume(this,text);
  pcVar1 = local_20;
  if (!bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,pcVar1,&local_81);
    std::operator+(&local_60,"Expected \"",&local_80);
    std::operator+(&local_40,&local_60,"\".");
    AddError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  return bVar2;
}

Assistant:

bool Parser::Consume(const char* text) {
  if (TryConsume(text)) {
    return true;
  } else {
    AddError("Expected \"" + std::string(text) + "\".");
    return false;
  }
}